

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O2

int chacha20_setup_crypto(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  EVP_CIPHER *cipher;
  int iVar1;
  undefined4 in_register_00000034;
  
  cipher = (EVP_CIPHER *)EVP_chacha20(ctx,CONCAT44(in_register_00000034,is_enc));
  iVar1 = cipher_setup_crypto(ctx,1,key,cipher,cipher_encrypt);
  return iVar1;
}

Assistant:

static int chacha20_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key)
{
    struct chacha20_context_t *ctx = (struct chacha20_context_t *)_ctx;
    ctx->super.do_dispose = chacha20_dispose;
    ctx->super.do_init = chacha20_init;
    ctx->super.do_transform = chacha20_transform;
    cf_chacha20_init(&ctx->chacha, key, PTLS_CHACHA20_KEY_SIZE, (const uint8_t *)"01234567" /* not used */);
    return 0;
}